

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

void gmath::svd<double,3,3>
               (SMatrix<double,_3,_3> *a,SMatrix<double,_3,_3> *u,SVector<double,_3> *w,
               SMatrix<double,_3,_3> *v)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  SMatrix<double,_3,_3> *in_RCX;
  SVector<double,_3> *in_RDX;
  SMatrix<double,_3,_3> *in_RSI;
  int i_1;
  int i;
  int nn;
  Vectord W;
  Matrixd V;
  Matrixd U;
  undefined1 in_stack_00000ae7;
  Matrixd *in_stack_00000ae8;
  Vectord *in_stack_00000af0;
  Matrixd *in_stack_00000af8;
  Matrixd *in_stack_00000b00;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int iVar4;
  undefined4 in_stack_fffffffffffffea4;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffea8;
  double dVar5;
  DMatrix<double> *in_stack_fffffffffffffeb0;
  DMatrix<double> *in_stack_fffffffffffffeb8;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  SMatrix<double,_3,_3> local_118;
  SMatrix<double,_3,_3> local_d0;
  DVector<double> local_70 [5];
  SMatrix<double,_3,_3> *local_20;
  SVector<double,_3> *local_18;
  SMatrix<double,_3,_3> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  DMatrix<double>::DMatrix
            ((DMatrix<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
  DMatrix<double>::DMatrix
            ((DMatrix<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
  DVector<double>::DVector
            ((DVector<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  DMatrix<double>::DMatrix<double,3,3>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  svd(in_stack_00000b00,in_stack_00000af8,in_stack_00000af0,in_stack_00000ae8,
      (bool)in_stack_00000ae7);
  DMatrix<double>::~DMatrix
            ((DMatrix<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  DMatrix::operator_cast_to_SMatrix(in_stack_fffffffffffffeb8);
  SMatrix<double,_3,_3>::operator=(local_10,&local_d0);
  DMatrix::operator_cast_to_SMatrix(in_stack_fffffffffffffeb8);
  SMatrix<double,_3,_3>::operator=(local_20,&local_118);
  local_120 = SVector<double,_3>::size(local_18);
  local_124 = DVector<double>::size(local_70);
  piVar2 = std::min<int>(&local_120,&local_124);
  local_11c = *piVar2;
  for (local_128 = 0; local_128 < local_11c; local_128 = local_128 + 1) {
    pdVar3 = DVector<double>::operator[](local_70,local_128);
    dVar5 = *pdVar3;
    pdVar3 = SVector<double,_3>::operator[](local_18,local_128);
    *pdVar3 = dVar5;
  }
  local_12c = local_11c;
  while( true ) {
    iVar4 = local_12c;
    iVar1 = SVector<double,_3>::size(local_18);
    if (iVar1 <= iVar4) break;
    pdVar3 = SVector<double,_3>::operator[](local_18,local_12c);
    *pdVar3 = 0.0;
    local_12c = local_12c + 1;
  }
  DVector<double>::~DVector((DVector<double> *)CONCAT44(iVar1,iVar4));
  DMatrix<double>::~DMatrix((DMatrix<double> *)CONCAT44(iVar1,iVar4));
  DMatrix<double>::~DMatrix((DMatrix<double> *)CONCAT44(iVar1,iVar4));
  return;
}

Assistant:

inline void svd(const SMatrix<T, m, n> &a,
    SMatrix<T, m, m> &u, SVector<T, n> &w, SMatrix<T, n, n> &v)
{
  Matrixd U, V;
  Vectord W;

  svd(a, U, W, V, false);
  u=U; v=V;

  int nn=std::min(w.size(), W.size());

  for (int i=0; i<nn; i++)
  {
    w[i]=W[i];
  }

  for (int i=nn; i < w.size(); i++)
  {
    w[i]=0;
  }
}